

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsItemFocused(void)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *window;
  ImGuiContext *g;
  bool local_1;
  
  pIVar1 = GImGui->CurrentWindow;
  if (((GImGui->NavId == 0) || ((GImGui->NavDisableHighlight & 1U) != 0)) ||
     (GImGui->NavId != (pIVar1->DC).LastItemId)) {
    local_1 = false;
  }
  else if (((pIVar1->DC).LastItemId == pIVar1->ID) && ((pIVar1->WriteAccessed & 1U) != 0)) {
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ImGui::IsItemFocused()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (g.NavId == 0 || g.NavDisableHighlight || g.NavId != window->DC.LastItemId)
        return false;

    // Special handling for the dummy item after Begin() which represent the title bar or tab.
    // When the window is collapsed (SkipItems==true) that last item will never be overwritten so we need to detect the case.
    if (window->DC.LastItemId == window->ID && window->WriteAccessed)
        return false;

    return true;
}